

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O3

void __thiscall pbrt::syntactic::Token::Token(Token *this,Loc *loc,Type type,string *text)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  int iVar3;
  
  (this->loc).file.super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (loc->file).super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (loc->file).super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->loc).file.super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  iVar3 = loc->col;
  (this->loc).line = loc->line;
  (this->loc).col = iVar3;
  this->type = type;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar2 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar2,pcVar2 + text->_M_string_length);
  return;
}

Assistant:

Token(const Loc &loc, const Type type, const std::string& text) : loc{loc}, type{type}, text{text} { }